

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.h
# Opt level: O1

Lit_t __thiscall Potassco::ProgramReader::matchLit(ProgramReader *this,char *err)

{
  long lVar1;
  bool bVar2;
  uint line;
  BufferedStream *this_00;
  ulong uVar3;
  int64_t x;
  Lit_t local_20;
  undefined4 uStack_1c;
  
  this_00 = stream(this);
  uVar3 = (ulong)this->varMax_;
  bVar2 = BufferedStream::match(this_00,(int64_t *)&local_20,false);
  if ((((!bVar2) || (lVar1 = CONCAT44(uStack_1c,local_20), lVar1 == 0)) ||
      (SBORROW8(lVar1,-uVar3) != (long)(lVar1 + uVar3) < 0)) || ((long)uVar3 < lVar1)) {
    line = BufferedStream::line(this_00);
    BufferedStream::fail(line,err);
  }
  return local_20;
}

Assistant:

Lit_t    matchLit(const char* err = "literal expected") { return Potassco::matchLit(*stream(), varMax_, err); }